

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.cpp
# Opt level: O3

string * __thiscall
Database::Last_abi_cxx11_(string *__return_storage_ptr__,Database *this,Date *date)

{
  bool bVar1;
  _Base_ptr p_Var2;
  ostream *poVar3;
  _Base_ptr p_Var4;
  _Base_ptr p_Var5;
  ostringstream fmt;
  char local_1a1;
  ostringstream local_1a0 [112];
  ios_base local_130 [264];
  
  if (((this->storage)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) ||
     (bVar1 = Date::operator>((Date *)((this->storage)._M_t._M_impl.super__Rb_tree_header._M_header.
                                       _M_left + 1),date), bVar1)) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,"No entries","");
    return __return_storage_ptr__;
  }
  p_Var4 = (this->storage)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var5 = &(this->storage)._M_t._M_impl.super__Rb_tree_header._M_header;
  p_Var2 = p_Var5;
  if (p_Var4 != (_Base_ptr)0x0) {
    do {
      bVar1 = Date::operator<((Date *)(p_Var4 + 1),date);
      if (!bVar1) {
        p_Var2 = p_Var4;
      }
      p_Var4 = (&p_Var4->_M_left)[bVar1];
    } while (p_Var4 != (_Base_ptr)0x0);
    bVar1 = p_Var2 != p_Var5;
    p_Var5 = p_Var2;
    if ((bVar1) && (bVar1 = Date::operator>((Date *)(p_Var2 + 1),date), !bVar1)) goto LAB_0010bc5f;
  }
  p_Var2 = (_Base_ptr)std::_Rb_tree_decrement(p_Var5);
LAB_0010bc5f:
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  poVar3 = operator<<((ostream *)local_1a0,(Date *)(p_Var2 + 1));
  local_1a1 = ' ';
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,&local_1a1,1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,*(char **)(p_Var2[1]._M_right + -1),(long)p_Var2[1]._M_right[-1]._M_parent);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  std::ios_base::~ios_base(local_130);
  return __return_storage_ptr__;
}

Assistant:

string Database::Last(const Date& date) const {
    if (storage.empty() || storage.begin()->first > date) {
        return "No entries";
    }

    auto it = storage.lower_bound(date);
    if (it == storage.end() || it->first > date) {
        --it;
    }

    ostringstream fmt;
    fmt << it->first << ' ' << it->second.back();

    return fmt.str();
}